

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

int Dau_DsdLevelVar(void *pMan,int iVar)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  
  pcVar3 = (char *)((long)pMan + (long)iVar * 8 + 0x28);
  iVar1 = 0;
  while( true ) {
    iVar2 = (int)*pcVar3;
    if (*pcVar3 == '\0') break;
    if ((iVar2 < *pMan + 0x61) || (*(int *)((long)pMan + 4) + 0x61 <= iVar2)) {
      iVar2 = *(int *)(*(long *)((long)pMan + 0x20) + -0x184 + (long)iVar2 * 4);
    }
    else {
      iVar2 = Dau_DsdLevelVar(pMan,iVar2 + -0x61);
      iVar2 = iVar2 + 1;
    }
    if (iVar1 <= iVar2) {
      iVar1 = iVar2;
    }
    pcVar3 = pcVar3 + 1;
  }
  return iVar1;
}

Assistant:

int Dau_DsdLevelVar( void * pMan, int iVar )
{
    Dau_Dsd_t * p = (Dau_Dsd_t *)pMan;
    char * pStr;
    int LevelMax = 0, Level;
    for ( pStr = p->pVarDefs[iVar]; *pStr; pStr++ )
    {
        if ( *pStr >= 'a' + p->nVarsInit && *pStr < 'a' + p->nVarsUsed )
            Level = 1 + Dau_DsdLevelVar( p, *pStr - 'a' );
        else
            Level = p->pVarLevels[*pStr - 'a'];
        LevelMax = Abc_MaxInt( LevelMax, Level );
    }
    return LevelMax;
}